

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O2

void __thiscall
cmCTestRunTest::WriteLogOutputTop(cmCTestRunTest *this,size_t completed,size_t total)

{
  pointer pbVar1;
  cmCTest *pcVar2;
  int iVar3;
  ostream *poVar4;
  ostringstream *poVar5;
  char *pcVar6;
  string *arg;
  pointer pbVar7;
  char *local_4d8 [4];
  string outname;
  ostringstream outputStream;
  long alStack_488 [45];
  ostringstream cmCTestLog_msg;
  ostringstream indexStr;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&outputStream);
  if ((this->NumberOfRunsLeft == 1) || (this->CTest->TestProgressOutput == true)) {
    iVar3 = getNumWidth(total);
    *(long *)((long)alStack_488 + *(long *)(_outputStream + -0x18)) = (long)iVar3;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&outputStream);
    std::operator<<(poVar4,"/");
    iVar3 = getNumWidth(total);
    *(long *)((long)alStack_488 + *(long *)(_outputStream + -0x18)) = (long)iVar3;
    poVar5 = (ostringstream *)std::ostream::_M_insert<unsigned_long>((ulong)&outputStream);
    pcVar6 = " ";
  }
  else {
    iVar3 = getNumWidth(total);
    poVar5 = &outputStream;
    *(long *)((long)alStack_488 + *(long *)(_outputStream + -0x18)) = (long)iVar3;
    pcVar6 = "  ";
    std::operator<<((ostream *)poVar5,"  ");
    iVar3 = getNumWidth(total);
    *(long *)((long)alStack_488 + *(long *)(_outputStream + -0x18)) = (long)iVar3;
  }
  std::operator<<((ostream *)poVar5,pcVar6);
  pcVar6 = "Test";
  if (this->TestHandler->MemCheck != false) {
    pcVar6 = "MemCheck";
  }
  std::operator<<((ostream *)&outputStream,pcVar6);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&indexStr);
  poVar4 = std::operator<<((ostream *)&indexStr," #");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->Index);
  std::operator<<(poVar4,":");
  iVar3 = getNumWidth((long)this->TestHandler->MaxIndex);
  *(long *)((long)alStack_488 + *(long *)(_outputStream + -0x18)) = (long)(iVar3 + 3);
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)&outputStream,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  std::operator<<((ostream *)&outputStream," ");
  iVar3 = cmCTest::GetMaxTestNameWidth(this->CTest);
  std::operator+(&outname,&this->TestProperties->Name," ");
  std::__cxx11::string::resize((ulong)&outname,(char)iVar3 + '\x04');
  std::operator<<((ostream *)&outputStream,(string *)&outname);
  poVar4 = (ostream *)
           std::ostream::operator<<(this->TestHandler->LogFile,this->TestProperties->Index);
  poVar4 = std::operator<<(poVar4,"/");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," Testing: ");
  poVar4 = std::operator<<(poVar4,(string *)this->TestProperties);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = (ostream *)
           std::ostream::operator<<(this->TestHandler->LogFile,this->TestProperties->Index);
  poVar4 = std::operator<<(poVar4,"/");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," Test: ");
  poVar4 = std::operator<<(poVar4,(string *)this->TestProperties);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(this->TestHandler->LogFile,"Command: \"");
  poVar4 = std::operator<<(poVar4,(string *)&this->ActualCommand);
  std::operator<<(poVar4,"\"");
  pbVar1 = (this->Arguments).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar7 = (this->Arguments).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; poVar4 = this->TestHandler->LogFile,
      pbVar7 != pbVar1; pbVar7 = pbVar7 + 1) {
    poVar4 = std::operator<<(poVar4," \"");
    poVar4 = std::operator<<(poVar4,(string *)pbVar7);
    std::operator<<(poVar4,"\"");
  }
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"Directory: ");
  poVar4 = std::operator<<(poVar4,(string *)&this->TestProperties->Directory);
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"\"");
  poVar4 = std::operator<<(poVar4,(string *)this->TestProperties);
  poVar4 = std::operator<<(poVar4,"\" start time: ");
  poVar4 = std::operator<<(poVar4,(string *)&this->StartTime);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(this->TestHandler->LogFile,"Output:");
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"----------------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(this->TestHandler->LogFile,(string *)&this->ProcessOutput);
  poVar4 = std::operator<<(poVar4,"<end of output>");
  std::endl<char,std::char_traits<char>>(poVar4);
  if (this->CTest->TestProgressOutput == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)&cmCTestLog_msg,(string *)local_4d8);
    std::__cxx11::string::~string((string *)local_4d8);
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x2e7,local_4d8[0],false);
    std::__cxx11::string::~string((string *)local_4d8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"Testing ");
  poVar4 = std::operator<<(poVar4,(string *)this->TestProperties);
  std::operator<<(poVar4," ... ");
  pcVar2 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x2eb,local_4d8[0],false);
  std::__cxx11::string::~string((string *)local_4d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&outname);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&indexStr);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&outputStream);
  return;
}

Assistant:

void cmCTestRunTest::WriteLogOutputTop(size_t completed, size_t total)
{
  std::ostringstream outputStream;

  // If this is the last or only run of this test, or progress output is
  // requested, then print out completed / total.
  // Only issue is if a test fails and we are running until fail
  // then it will never print out the completed / total, same would
  // got for run until pass.  Trick is when this is called we don't
  // yet know if we are passing or failing.
  if (this->NumberOfRunsLeft == 1 || this->CTest->GetTestProgressOutput()) {
    outputStream << std::setw(getNumWidth(total)) << completed << "/";
    outputStream << std::setw(getNumWidth(total)) << total << " ";
  }
  // if this is one of several runs of a test just print blank space
  // to keep things neat
  else {
    outputStream << std::setw(getNumWidth(total)) << "  ";
    outputStream << std::setw(getNumWidth(total)) << "  ";
  }

  if (this->TestHandler->MemCheck) {
    outputStream << "MemCheck";
  } else {
    outputStream << "Test";
  }

  std::ostringstream indexStr;
  indexStr << " #" << this->Index << ":";
  outputStream << std::setw(3 + getNumWidth(this->TestHandler->GetMaxIndex()))
               << indexStr.str();
  outputStream << " ";

  const int maxTestNameWidth = this->CTest->GetMaxTestNameWidth();
  std::string outname = this->TestProperties->Name + " ";
  outname.resize(maxTestNameWidth + 4, '.');
  outputStream << outname;

  *this->TestHandler->LogFile << this->TestProperties->Index << "/"
                              << this->TestHandler->TotalNumberOfTests
                              << " Testing: " << this->TestProperties->Name
                              << std::endl;
  *this->TestHandler->LogFile << this->TestProperties->Index << "/"
                              << this->TestHandler->TotalNumberOfTests
                              << " Test: " << this->TestProperties->Name
                              << std::endl;
  *this->TestHandler->LogFile << "Command: \"" << this->ActualCommand << "\"";

  for (std::string const& arg : this->Arguments) {
    *this->TestHandler->LogFile << " \"" << arg << "\"";
  }
  *this->TestHandler->LogFile
    << std::endl
    << "Directory: " << this->TestProperties->Directory << std::endl
    << "\"" << this->TestProperties->Name
    << "\" start time: " << this->StartTime << std::endl;

  *this->TestHandler->LogFile
    << "Output:" << std::endl
    << "----------------------------------------------------------"
    << std::endl;
  *this->TestHandler->LogFile << this->ProcessOutput << "<end of output>"
                              << std::endl;

  if (!this->CTest->GetTestProgressOutput()) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, outputStream.str());
  }

  cmCTestLog(this->CTest, DEBUG,
             "Testing " << this->TestProperties->Name << " ... ");
}